

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

int __thiscall NNTreeImpl::remove(NNTreeImpl *this,char *__filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  iterator iter;
  QPDFObjectHandle local_80;
  undefined1 local_70 [96];
  
  local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)__filename;
  local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__filename + 8);
  if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  find((iterator *)local_70,this,&local_80,false);
  if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (-1 < (int)local_70._56_4_) {
    if (in_RDX != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      NNTreeIterator::updateIValue((NNTreeIterator *)local_70,false);
      this = (NNTreeImpl *)(local_70 + 0x58);
      in_RDX->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._80_8_;
      in_RDX = in_RDX + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (in_RDX,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)this);
    }
    NNTreeIterator::remove((NNTreeIterator *)local_70,(char *)this);
  }
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_70);
  return (int)CONCAT71((int7)((ulong)in_RDX >> 8),-1 < (int)local_70._56_4_);
}

Assistant:

bool
NNTreeImpl::remove(QPDFObjectHandle key, QPDFObjectHandle* value)
{
    auto iter = find(key, false);
    if (!iter.valid()) {
        QTC::TC("qpdf", "NNTree remove not found");
        return false;
    }
    if (value) {
        *value = iter->second;
    }
    iter.remove();
    return true;
}